

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

vector map_get(map m,map_key key)

{
  comparable_callback compare_cb;
  bucket in_RSI;
  long in_RDI;
  bucket b;
  size_t index;
  map_hash hash;
  undefined8 local_8;
  
  if ((in_RDI == 0) || (in_RSI == (bucket)0x0)) {
    local_8 = (vector)0x0;
  }
  else {
    compare_cb = (comparable_callback)(**(code **)(in_RDI + 0x20))(in_RSI);
    local_8 = bucket_get_pairs_value
                        (in_RSI,compare_cb,(void *)((ulong)compare_cb % *(ulong *)(in_RDI + 8)));
  }
  return local_8;
}

Assistant:

vector map_get(map m, map_key key)
{
	if (m != NULL && key != NULL)
	{
		map_hash hash = m->hash_cb(key);

		size_t index = hash % m->capacity;

		bucket b = &m->buckets[index];

		return bucket_get_pairs_value(b, m->compare_cb, key);
	}

	return NULL;
}